

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

Gia_Man_t * Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *pNtk)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  int local_74;
  int local_54;
  int local_40;
  int local_3c;
  int Counter;
  int i;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pModel;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fUseInter;
  int fUseBufs;
  Abc_Ntk_t *pNtk_local;
  
  pNew._4_4_ = 1;
  pNew._0_4_ = 0;
  local_40 = -1;
  _fUseInter = pNtk;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 != 0) {
    Abc_NtkFillTemp(_fUseInter);
    iVar1 = Abc_NtkObjNumMax(_fUseInter);
    pTemp = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(_fUseInter->pName);
    pTemp->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(_fUseInter->pSpec);
    pTemp->pSpec = pcVar3;
    if (pNew._4_4_ != 0) {
      pVVar4 = Vec_IntAlloc(1000);
      pTemp->vBarBufs = pVVar4;
    }
    for (local_3c = 0; iVar1 = local_3c, iVar2 = Abc_NtkPiNum(_fUseInter), iVar1 < iVar2;
        local_3c = local_3c + 1) {
      _Counter = Abc_NtkPi(_fUseInter,local_3c);
      iVar1 = Gia_ManAppendCi(pTemp);
      (_Counter->field_6).iTemp = iVar1;
    }
    for (local_3c = 0; iVar1 = local_3c, iVar2 = Abc_NtkPiNum(_fUseInter), iVar1 < iVar2;
        local_3c = local_3c + 1) {
      _Counter = Abc_NtkPi(_fUseInter,local_3c);
      if ((int)pNew == 0) {
        local_54 = (_Counter->field_6).iTemp;
      }
      else {
        local_54 = Gia_ManAppendBuf(pTemp,(_Counter->field_6).iTemp);
      }
      pAVar6 = Abc_ObjFanout0(_Counter);
      (pAVar6->field_6).iTemp = local_54;
    }
    if (_fUseInter->pDesign == (Abc_Des_t *)0x0) {
      pVVar5 = Abc_NtkDfsWithBoxes(_fUseInter);
      _fUseInter->pData = pVVar5;
    }
    else {
      for (local_3c = 0; iVar1 = local_3c, iVar2 = Vec_PtrSize(_fUseInter->pDesign->vModules),
          iVar1 < iVar2; local_3c = local_3c + 1) {
        pTerm = (Abc_Obj_t *)Vec_PtrEntry(_fUseInter->pDesign->vModules,local_3c);
        pVVar5 = Abc_NtkDfsWithBoxes((Abc_Ntk_t *)pTerm);
        pTerm[4].field_5.pData = pVVar5;
      }
    }
    Gia_ManHashAlloc(pTemp);
    Abc_NtkFlattenHierarchyGia2_rec(pTemp,_fUseInter,&local_40,pTemp->vBarBufs);
    Gia_ManHashStop(pTemp);
    printf("Hierarchy reader flattened %d instances of logic boxes.\n");
    if (_fUseInter->pDesign == (Abc_Des_t *)0x0) {
      Vec_PtrFreeP((Vec_Ptr_t **)&_fUseInter->pData);
    }
    else {
      for (local_3c = 0; iVar1 = local_3c, iVar2 = Vec_PtrSize(_fUseInter->pDesign->vModules),
          iVar1 < iVar2; local_3c = local_3c + 1) {
        pTerm = (Abc_Obj_t *)Vec_PtrEntry(_fUseInter->pDesign->vModules,local_3c);
        Vec_PtrFreeP((Vec_Ptr_t **)&pTerm[4].field_5.pData);
      }
    }
    for (local_3c = 0; iVar1 = local_3c, iVar2 = Abc_NtkPoNum(_fUseInter), iVar1 < iVar2;
        local_3c = local_3c + 1) {
      _Counter = Abc_NtkPo(_fUseInter,local_3c);
      p = pTemp;
      if ((int)pNew == 0) {
        pAVar6 = Abc_ObjFanin0(_Counter);
        local_74 = (pAVar6->field_6).iTemp;
      }
      else {
        pAVar6 = Abc_ObjFanin0(_Counter);
        local_74 = Gia_ManAppendBuf(p,(pAVar6->field_6).iTemp);
      }
      (_Counter->field_6).iTemp = local_74;
    }
    for (local_3c = 0; iVar1 = local_3c, iVar2 = Abc_NtkPoNum(_fUseInter), iVar1 < iVar2;
        local_3c = local_3c + 1) {
      _Counter = Abc_NtkPo(_fUseInter,local_3c);
      Gia_ManAppendCo(pTemp,(_Counter->field_6).iTemp);
    }
    if ((int)pNew != 0) {
      Vec_IntPush(pTemp->vBarBufs,0);
      pVVar4 = pTemp->vBarBufs;
      iVar1 = Abc_NtkPiNum(_fUseInter);
      Vec_IntPush(pVVar4,iVar1);
      pVVar4 = pTemp->vBarBufs;
      iVar1 = Gia_ManBufNum(pTemp);
      iVar2 = Abc_NtkPoNum(_fUseInter);
      Vec_IntPush(pVVar4,iVar1 - iVar2);
      pVVar4 = pTemp->vBarBufs;
      iVar1 = Abc_NtkPoNum(_fUseInter);
      Vec_IntPush(pVVar4,iVar1);
    }
    if (pNew._4_4_ != 0) {
      Vec_IntPrint(pTemp->vBarBufs);
    }
    pModel = (Abc_Ntk_t *)pTemp;
    pTemp = Gia_ManCleanup(pTemp);
    Gia_ManStop((Gia_Man_t *)pModel);
    return pTemp;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x8e,"Gia_Man_t *Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *)");
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia2( Abc_Ntk_t * pNtk )
{
    int fUseBufs = 1;
    int fUseInter = 0;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    int i, Counter = -1;
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );
    Abc_NtkFillTemp( pNtk );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);
    if ( fUseBufs )
        pNew->vBarBufs = Vec_IntAlloc( 1000 );

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, pTerm->iTemp) : pTerm->iTemp;

    // create DFS order of nets
    if ( !pNtk->pDesign )
        pNtk->pData = Abc_NtkDfsWithBoxes( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            pModel->pData = Abc_NtkDfsWithBoxes( pModel );

    // call recursively
    Gia_ManHashAlloc( pNew );
    Abc_NtkFlattenHierarchyGia2_rec( pNew, pNtk, &Counter, pNew->vBarBufs );
    Gia_ManHashStop( pNew );
    printf( "Hierarchy reader flattened %d instances of logic boxes.\n", Counter );

    // delete DFS order of nets
    if ( !pNtk->pDesign )
        Vec_PtrFreeP( (Vec_Ptr_t **)&pNtk->pData );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Vec_PtrFreeP( (Vec_Ptr_t **)&pModel->pData );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, Abc_ObjFanin0(pTerm)->iTemp) : Abc_ObjFanin0(pTerm)->iTemp;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    // save buffers
    if ( fUseInter )
    {
        Vec_IntPush( pNew->vBarBufs, 0 );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPiNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPoNum(pNtk) );
    }
    if ( fUseBufs )
        Vec_IntPrint( pNew->vBarBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}